

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O2

char * ExpandScope(Scope *scope,int tab)

{
  char *right;
  bool bVar1;
  int i;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = "[";
  bVar1 = true;
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < scope->nodeLength; lVar2 = lVar2 + 1) {
    if (((&scope->nodes->isStmt)[lVar4] == true) &&
       (*(int *)((long)&scope->nodes->scopeId + lVar4) == *scope->scopes)) {
      putchar(10);
      right = ExpandASTNode(scope,(ASTNode *)((long)&scope->nodes->type + lVar4),tab);
      if (!bVar1) {
        pcVar3 = Concat(pcVar3,",");
      }
      pcVar3 = Concat(pcVar3,right);
      bVar1 = false;
    }
    lVar4 = lVar4 + 0x38;
  }
  pcVar3 = Concat(pcVar3,"]");
  return pcVar3;
}

Assistant:

char* ExpandScope(Scope* scope, int tab){
	char* json = "[";
	bool first = true;
	for (int i = 0; i < scope->nodeLength; i++){
		if (scope->nodes[i].isStmt && scope->nodes[i].scopeId == scope->scopes[0]){
			printf("\n");
			char* results = ExpandASTNode(scope, &scope->nodes[i], tab);
			if (first) first = false;
			else json = Concat(json, ",");
			json = Concat(json, results);
		}
	}
	return Concat(json, "]");
}